

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O2

void readBup<BupHeaderPS3>(istream *stream,BupHeader *header)

{
  BupExpressionChunk *out;
  pointer pBVar1;
  pointer pBVar2;
  BupChunkPS3 BVar3;
  size_t len;
  BupChunk *chunk;
  pointer pBVar4;
  ulong __val;
  long lVar5;
  string local_c0;
  BupHeaderPS3 h;
  string local_80;
  BupExpressionChunkPS3 c;
  
  header->isSwitch = false;
  readRaw<BupHeaderPS3>(&h,stream);
  copyTo<BupHeaderPS3>(header,&h);
  std::istream::ignore((long)stream);
  pBVar1 = (header->chunks).super__Vector_base<BupChunk,_std::allocator<BupChunk>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pBVar4 = (header->chunks).super__Vector_base<BupChunk,_std::allocator<BupChunk>_>._M_impl.
                super__Vector_impl_data._M_start; pBVar4 != pBVar1; pBVar4 = pBVar4 + 1) {
    BVar3 = readRaw<BupChunkPS3>(stream);
    pBVar4->offset = (uint32_t)BVar3.offset.value_;
  }
  lVar5 = 0;
  std::istream::ignore((long)stream);
  for (__val = 0;
      pBVar2 = (header->expChunks).
               super__Vector_base<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>._M_impl.
               super__Vector_impl_data._M_start,
      __val < (ulong)((long)(header->expChunks).
                            super__Vector_base<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar2 >> 6);
      __val = __val + 1) {
    out = (BupExpressionChunk *)((long)&(pBVar2->name)._M_dataplus._M_p + lVar5);
    readRaw<BupExpressionChunkPS3>(&c,stream);
    copyTo<BupExpressionChunkPS3>(out,&c);
    len = strnlen(c.name,0x10);
    toUTF8_abi_cxx11_(&local_80,c.name,len);
    std::__cxx11::string::operator=((string *)out,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    if (*(long *)((long)&(pBVar2->name)._M_string_length + lVar5) == 0) {
      std::__cxx11::to_string(&local_c0,__val);
      std::operator+(&local_80,"expression",&local_c0);
      std::__cxx11::string::operator=((string *)out,(string *)&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_c0);
    }
    lVar5 = lVar5 + 0x40;
  }
  return;
}

Assistant:

void readBup(std::istream& stream, BupHeader& header) {
	header.isSwitch = Header::IsSwitch::value;
	Header h = readRaw<Header>(stream);
	copyTo(header, h);

	// Skip bytes for unknown reason
	stream.ignore(h.tbl1.value() * h.skipAmount);

	for (auto& chunk : header.chunks) {
		auto c = readRaw<typename Header::Chunk>(stream);
		copyTo(chunk, c);
	}

	stream.ignore(h.skipAmount2);

	for (size_t i = 0; i < header.expChunks.size(); i++) {
		auto& expChunk = header.expChunks[i];

		auto c = readRaw<typename Header::ExpressionChunk>(stream);
		copyTo(expChunk, c);
		expChunk.name = toUTF8(c.name, strnlen(c.name, sizeof(c.name)));

		if (!c.unkBytesValid()) {
			std::cerr << "Expression " << i << ", " << expChunk.name << ", had unexpected nonzero values in its expression data..." << std::endl;
		}

		if (expChunk.name.empty()) {
			expChunk.name = "expression" + std::to_string(i);
		}
	}
}